

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::SetPermissions(cmFileCopier *this,string *toFile,mode_t permissions)

{
  cmExecutionStatus *pcVar1;
  Status SVar2;
  ostream *poVar3;
  bool bVar4;
  ostringstream e;
  string asStack_1b8 [32];
  ostringstream local_198 [376];
  
  bVar4 = true;
  if (permissions != 0) {
    SVar2 = cmsys::SystemTools::SetPermissions(toFile,permissions,false);
    if (SVar2.Kind_ != Success) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      poVar3 = std::operator<<((ostream *)local_198,this->Name);
      poVar3 = std::operator<<(poVar3," cannot set permissions on \"");
      poVar3 = std::operator<<(poVar3,(string *)toFile);
      poVar3 = std::operator<<(poVar3,"\": ");
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      poVar3 = std::operator<<(poVar3,asStack_1b8);
      std::operator<<(poVar3,".");
      std::__cxx11::string::~string(asStack_1b8);
      pcVar1 = this->Status;
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
      std::__cxx11::string::~string(asStack_1b8);
      std::__cxx11::ostringstream::~ostringstream(local_198);
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool cmFileCopier::SetPermissions(const std::string& toFile,
                                  mode_t permissions)
{
  if (permissions) {
#ifdef _WIN32
    if (Makefile->IsOn("CMAKE_CROSSCOMPILING")) {
      // Store the mode in an NTFS alternate stream.
      std::string mode_t_adt_filename = toFile + ":cmake_mode_t";

      // Writing to an NTFS alternate stream changes the modification
      // time, so we need to save and restore its original value.
      cmFileTimes file_time_orig(toFile);
      {
        cmsys::ofstream permissionStream(mode_t_adt_filename.c_str());
        if (permissionStream) {
          permissionStream << std::oct << permissions << std::endl;
        }
        permissionStream.close();
      }
      file_time_orig.Store(toFile);
    }
#endif

    if (!cmSystemTools::SetPermissions(toFile, permissions)) {
      std::ostringstream e;
      e << this->Name << " cannot set permissions on \"" << toFile
        << "\": " << cmSystemTools::GetLastSystemError() << ".";
      this->Status.SetError(e.str());
      return false;
    }
  }
  return true;
}